

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O1

int get_one_and_zeros_padding(uchar *input,size_t input_len,size_t *data_len)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  byte bVar9;
  bool bVar10;
  
  iVar2 = -0x6100;
  if (data_len != (size_t *)0x0 && input != (uchar *)0x0) {
    *data_len = 0;
    if (input_len == 0) {
      return -0x6200;
    }
    uVar3 = *data_len;
    uVar4 = input_len - 1;
    bVar1 = 0x80;
    bVar6 = 0;
    do {
      bVar7 = bVar1;
      bVar5 = input[uVar4] != '\0' | bVar6;
      uVar8 = uVar4;
      if (bVar5 == bVar6) {
        uVar8 = 0;
      }
      uVar3 = uVar3 | uVar8;
      *data_len = uVar3;
      bVar9 = 0;
      if (bVar5 != bVar6) {
        bVar9 = input[uVar4];
      }
      bVar10 = uVar4 != 0;
      uVar4 = uVar4 - 1;
      bVar1 = bVar9 ^ bVar7;
      bVar6 = bVar5;
    } while (bVar10);
    iVar2 = -0x6200;
    if (bVar9 == bVar7) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int get_one_and_zeros_padding( unsigned char *input, size_t input_len,
                                      size_t *data_len )
{
    size_t i;
    unsigned char done = 0, prev_done, bad;

    if( NULL == input || NULL == data_len )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    bad = 0x80;
    *data_len = 0;
    for( i = input_len; i > 0; i-- )
    {
        prev_done = done;
        done |= ( input[i - 1] != 0 );
        *data_len |= ( i - 1 ) * ( done != prev_done );
        bad ^= input[i - 1] * ( done != prev_done );
    }

    return( MBEDTLS_ERR_CIPHER_INVALID_PADDING * ( bad != 0 ) );

}